

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

Result __thiscall wabt::FileStream::WriteDataImpl(FileStream *this,size_t at,void *data,size_t size)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  uint *puVar4;
  FILE *pFVar5;
  undefined8 uVar6;
  Enum EVar7;
  char *__format;
  
  pFVar5 = (FILE *)this->file_;
  EVar7 = Error;
  if (pFVar5 == (FILE *)0x0) {
    return (Result)Error;
  }
  if (size == 0) {
LAB_0011837b:
    EVar7 = Ok;
  }
  else {
    if (this->offset_ == at) {
LAB_00118363:
      sVar3 = fwrite(data,size,1,pFVar5);
      pFVar5 = _stderr;
      if (sVar3 == 1) {
        this->offset_ = this->offset_ + size;
        goto LAB_0011837b;
      }
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      __format = "%s:%d: fwrite size=%zd failed, errno=%d\n";
      uVar6 = 0x122;
    }
    else {
      iVar2 = fseek(pFVar5,at,0);
      pFVar5 = _stderr;
      if (iVar2 == 0) {
        this->offset_ = at;
        pFVar5 = (FILE *)this->file_;
        goto LAB_00118363;
      }
      puVar4 = (uint *)__errno_location();
      uVar1 = *puVar4;
      __format = "%s:%d: fseek offset=%zd failed, errno=%d\n";
      uVar6 = 0x11c;
    }
    fprintf(pFVar5,__format,
            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/stream.cc",
            uVar6,size,(ulong)uVar1);
  }
  return (Result)EVar7;
}

Assistant:

Result FileStream::WriteDataImpl(size_t at, const void* data, size_t size) {
  if (!file_) {
    return Result::Error;
  }
  if (size == 0) {
    return Result::Ok;
  }
  if (at != offset_) {
    if (fseek(file_, at, SEEK_SET) != 0) {
      ERROR("fseek offset=%" PRIzd " failed, errno=%d\n", size, errno);
      return Result::Error;
    }
    offset_ = at;
  }
  if (fwrite(data, size, 1, file_) != 1) {
    ERROR("fwrite size=%" PRIzd " failed, errno=%d\n", size, errno);
    return Result::Error;
  }
  offset_ += size;
  return Result::Ok;
}